

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O1

void qsoundc_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  qsound_chip *chip;
  
  uVar1 = *(uint *)((long)info + 0x10);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)info + 8)),data,__n);
  return;
}

Assistant:

static void qsoundc_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	struct qsound_chip* chip = (struct qsound_chip*)info;
	
	if (offset > chip->romSize)
		return;
	if (offset + length > chip->romSize)
		length = chip->romSize - offset;
	
	memcpy(chip->romData + offset, data, length);
	
	return;
}